

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

fdb_status
filemgr_do_readahead
          (filemgr *file,bid_t bid,void *buf,void *buf_aligned,err_log_callback *log_callback)

{
  ulong uVar1;
  bid_t *pbVar2;
  ssize_t sVar3;
  fdb_status fVar4;
  size_t ii;
  size_t ii_1;
  ulong uVar5;
  plock_entry_t *ee;
  list<plock_node_*,_std::allocator<plock_node_*>_> plock_entries;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  bid_t is_writer;
  _List_node_header local_70;
  FdbGcFunc auto_unlock;
  
  uVar1 = (file->latest_filesize).super___atomic_base<unsigned_long>._M_i / (ulong)file->blocksize;
  uVar5 = uVar1 - bid;
  if (uVar1 < bid) {
    uVar5 = 0;
  }
  if (global_config.num_blocks_readahead + bid <= uVar1) {
    uVar5 = (ulong)global_config.num_blocks_readahead;
  }
  plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&plock_entries;
  plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>._M_impl._M_node.
  _M_size = 0;
  plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>._M_impl._M_node.
       super__List_node_base._M_next;
  for (uVar1 = 1; uVar1 < uVar5; uVar1 = uVar1 + 1) {
    auto_unlock._0_8_ = bid + uVar1;
    is_writer = 0;
    ee = plock_lock(&file->plock,&auto_unlock,&is_writer);
    std::__cxx11::list<plock_node_*,_std::allocator<plock_node_*>_>::push_back(&plock_entries,&ee);
  }
  is_writer = (bid_t)file;
  std::__cxx11::list<plock_node_*,_std::allocator<plock_node_*>_>::list
            ((list<plock_node_*,_std::allocator<plock_node_*>_> *)&local_70,&plock_entries);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  pbVar2 = (bid_t *)operator_new(0x20);
  *pbVar2 = is_writer;
  std::__detail::_List_node_header::_List_node_header((_List_node_header *)(pbVar2 + 1),&local_70);
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc:1997:28)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc:1997:28)>
             ::_M_manager;
  local_98._M_unused._M_object = pbVar2;
  FdbGcFunc::FdbGcFunc(&auto_unlock,(Func *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::__cxx11::_List_base<plock_node_*,_std::allocator<plock_node_*>_>::_M_clear
            ((_List_base<plock_node_*,_std::allocator<plock_node_*>_> *)&local_70);
  sVar3 = filemgr_read_blocks(file,buf_aligned,(uint)uVar5,bid);
  if (sVar3 == uVar5 * (long)global_config.blocksize) {
    memcpy(buf,buf_aligned,(long)global_config.blocksize);
    fVar4 = FDB_RESULT_SUCCESS;
    for (uVar1 = 0; uVar5 != uVar1; uVar1 = uVar1 + 1) {
      bcache_write(file,bid + uVar1,
                   (void *)((long)global_config.blocksize * uVar1 + (long)buf_aligned),
                   BCACHE_REQ_CLEAN,false,true);
    }
  }
  else {
    fVar4 = FDB_RESULT_READ_FAIL;
    fdb_log_impl(log_callback,2,FDB_RESULT_READ_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                 ,"filemgr_do_readahead",0x7da,
                 "Read-ahead error: failed to read BID %lu in a database file \'%s\', num blocks %lu, pos %zu, filesize %zu\n"
                 ,bid,file->filename,uVar5,(file->pos).super___atomic_base<unsigned_long>._M_i,
                 (file->latest_filesize).super___atomic_base<unsigned_long>._M_i);
  }
  FdbGcFunc::~FdbGcFunc(&auto_unlock);
  std::__cxx11::_List_base<plock_node_*,_std::allocator<plock_node_*>_>::_M_clear
            (&plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>);
  return fVar4;
}

Assistant:

fdb_status filemgr_do_readahead(struct filemgr *file, bid_t bid, void *buf,
                        void* buf_aligned,
                        err_log_callback *log_callback)
{
    uint64_t total_blocks = atomic_get_uint64_t(&file->latest_filesize) / file->blocksize;
    size_t num_blocks_to_read = global_config.num_blocks_readahead;
    if (bid + num_blocks_to_read > total_blocks) {
        num_blocks_to_read = (total_blocks >= bid) ? total_blocks - bid : 0;
    }

    // Should lock all individual blocks except for the first block
    // (the first block is already locked by the caller).
    std::list<plock_entry_t*> plock_entries;
    for (size_t ii = 1; ii < num_blocks_to_read; ++ii) {
        bid_t locking_bid = bid + ii;
        bid_t is_writer = 0; // read operation.
        plock_entry_t* ee = plock_lock(&file->plock, &locking_bid, &is_writer);
        plock_entries.push_back(ee);
    }
    FdbGcFunc auto_unlock{ [file, plock_entries](){
        for (plock_entry_t* ee: plock_entries) {
            plock_unlock(&file->plock, ee);
        }
    } };

    ssize_t r = filemgr_read_blocks(file, buf_aligned, num_blocks_to_read, bid);
    if (r != (ssize_t)num_blocks_to_read * global_config.blocksize) {
        const char *msg = "Read-ahead error: failed to read BID %" _F64 " in a "
            "database file '%s', num blocks %" _F64 ", pos %zu, filesize %zu\n";
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                msg, bid, file->filename, num_blocks_to_read,
                atomic_get_uint64_t(&file->pos),
                atomic_get_uint64_t(&file->latest_filesize));
        return FDB_RESULT_READ_FAIL;
    }

    uint8_t* ptr = (uint8_t*)buf_aligned;

    // Copy the contents of the first block to user's buffer.
    memcpy(buf, ptr, global_config.blocksize);

    for (size_t ii = 0; ii < num_blocks_to_read; ++ii) {
        bid_t writing_bid = bid + ii;
        bcache_write(file, writing_bid, ptr + (ii * global_config.blocksize),
                     BCACHE_REQ_CLEAN, false, true);
    }

    return FDB_RESULT_SUCCESS;
}